

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O0

void __thiscall
CVIterator_Preincrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>_>::
TestBody(CVIterator_Preincrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>_>
         *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [8];
  AssertionResult gtest_ar_5;
  Message local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_4;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_3;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_60 [8];
  TypeParam it;
  Message local_38;
  uint local_2c;
  size_type local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  CVIterator_Preincrement_Test<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>_>
  *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::size
                       (&(this->
                         super_CVIterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>_>
                         ).cv_);
  local_2c = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_20,"this->cv_.size ()","4U",&local_28,&local_2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it.index_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it.index_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it.index_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::begin
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)&gtest_ar_1.message_);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::iterator_base
            ((iterator_base<true> *)local_60,(iterator_base<false> *)&gtest_ar_1.message_);
  pvVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator*
                     ((iterator_base<true> *)local_60);
  local_84 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_80,"*it","2",pvVar3,&local_84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator++
            ((iterator_base<true> *)local_60);
  pvVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator*
                     ((iterator_base<true> *)local_60);
  local_ac = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a8,"*it","3",pvVar3,&local_ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator++
            ((iterator_base<true> *)local_60);
  pvVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator*
                     ((iterator_base<true> *)local_60);
  local_d4 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d0,"*it","5",pvVar3,&local_d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator++
            ((iterator_base<true> *)local_60);
  pvVar3 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator*
                     ((iterator_base<true> *)local_60);
  local_fc = 7;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f8,"*it","7",pvVar3,&local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xd8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator++
            ((iterator_base<true> *)local_60);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::end
            ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_130);
  testing::internal::EqHelper::
  Compare<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>,_pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>,_nullptr>
            ((EqHelper *)local_120,"it","this->cv_.end ()",(iterator_base<true> *)local_60,
             (iterator_base<false> *)local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0xda,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  return;
}

Assistant:

TYPED_TEST (CVIterator, Preincrement) {
    EXPECT_EQ (this->cv_.size (), 4U);

    TypeParam it = this->cv_.begin ();
    EXPECT_EQ (*it, 2);
    ++it;
    EXPECT_EQ (*it, 3);
    ++it;
    EXPECT_EQ (*it, 5);
    ++it;
    EXPECT_EQ (*it, 7);
    ++it;
    EXPECT_EQ (it, this->cv_.end ());
}